

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_monitor.cpp
# Opt level: O2

void __thiscall r_exec::_GMonitor::invalidate_sim_outcomes(_GMonitor *this)

{
  SolutionList *pSVar1;
  _List_node_base *p_Var2;
  
  p_Var2 = (_List_node_base *)&this->sim_failures;
  while (p_Var2 = (((SolutionList *)&p_Var2->_M_next)->
                  super__List_base<std::pair<core::P<r_exec::Goal>,_core::P<r_exec::Sim>_>,_std::allocator<std::pair<core::P<r_exec::Goal>,_core::P<r_exec::Sim>_>_>_>
                  )._M_impl._M_node.super__List_node_base._M_next,
        (SimOutcomes *)p_Var2 != &this->sim_failures) {
    Sim::invalidate(*(Sim **)((long)(p_Var2 + 1) + 8));
  }
  pSVar1 = &(this->sim_failures).optional_solutions;
  p_Var2 = (_List_node_base *)pSVar1;
  while (p_Var2 = (((_List_base<std::pair<core::P<r_exec::Goal>,_core::P<r_exec::Sim>_>,_std::allocator<std::pair<core::P<r_exec::Goal>,_core::P<r_exec::Sim>_>_>_>
                     *)&p_Var2->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var2 != (_List_node_base *)pSVar1) {
    Sim::invalidate((Sim *)p_Var2[1]._M_prev);
  }
  p_Var2 = (_List_node_base *)&this->sim_successes;
  while (p_Var2 = (((SolutionList *)&p_Var2->_M_next)->
                  super__List_base<std::pair<core::P<r_exec::Goal>,_core::P<r_exec::Sim>_>,_std::allocator<std::pair<core::P<r_exec::Goal>,_core::P<r_exec::Sim>_>_>_>
                  )._M_impl._M_node.super__List_node_base._M_next,
        (SimOutcomes *)p_Var2 != &this->sim_successes) {
    Sim::invalidate(*(Sim **)((long)(p_Var2 + 1) + 8));
  }
  pSVar1 = &(this->sim_successes).optional_solutions;
  p_Var2 = (_List_node_base *)pSVar1;
  while (p_Var2 = (((_List_base<std::pair<core::P<r_exec::Goal>,_core::P<r_exec::Sim>_>,_std::allocator<std::pair<core::P<r_exec::Goal>,_core::P<r_exec::Sim>_>_>_>
                     *)&p_Var2->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var2 != (_List_node_base *)pSVar1) {
    Sim::invalidate((Sim *)p_Var2[1]._M_prev);
  }
  return;
}

Assistant:

void _GMonitor::invalidate_sim_outcomes()
{
    SolutionList::const_iterator sol;

    for (sol = sim_failures.mandatory_solutions.begin(); sol != sim_failures.mandatory_solutions.end(); ++sol) {
        (*sol).second->invalidate();
    }

    for (sol = sim_failures.optional_solutions.begin(); sol != sim_failures.optional_solutions.end(); ++sol) {
        (*sol).second->invalidate();
    }

    for (sol = sim_successes.mandatory_solutions.begin(); sol != sim_successes.mandatory_solutions.end(); ++sol) {
        (*sol).second->invalidate();
    }

    for (sol = sim_successes.optional_solutions.begin(); sol != sim_successes.optional_solutions.end(); ++sol) {
        (*sol).second->invalidate();
    }
}